

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall wasm::GenerateDynCalls::~GenerateDynCalls(GenerateDynCalls *this)

{
  GenerateDynCalls *this_local;
  
  ~GenerateDynCalls(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

GenerateDynCalls(bool onlyI64) : onlyI64(onlyI64) {}